

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O2

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::visitToken(MetadataVisitor *this,Token token)

{
  undefined8 *puVar1;
  SyntaxKind SVar2;
  double dVar3;
  NumericTokenFlags NVar4;
  TokenKind TVar5;
  optional<slang::TimeScaleValue> oVar6;
  optional<slang::TimeScaleValue> oVar7;
  SyntaxNode *pSVar8;
  long lVar9;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar10;
  Trivia t;
  undefined1 local_58 [13];
  char cStack_4b;
  Token local_40;
  
  local_40.info = token.info;
  local_40._0_8_ = token._0_8_;
  sVar10 = Token::trivia(&local_40);
  for (lVar9 = 0; sVar10._M_extent._M_extent_value._M_extent_value << 4 != lVar9;
      lVar9 = lVar9 + 0x10) {
    puVar1 = (undefined8 *)((long)&(sVar10._M_ptr)->field_0 + lVar9);
    local_58._0_8_ = *puVar1;
    unique0x10000185 = puVar1[1];
    if (cStack_4b == Directive) {
      pSVar8 = Trivia::syntax((Trivia *)local_58);
      SVar2 = pSVar8->kind;
      if (SVar2 == CellDefineDirective) {
        this->cellDefine = true;
      }
      else if (SVar2 == UnconnectedDriveDirective) {
        this->unconnectedDrive = *(TokenKind *)&pSVar8[1].previewNode;
      }
      else if (SVar2 == EndCellDefineDirective) {
        this->cellDefine = false;
      }
      else if (SVar2 == NoUnconnectedDriveDirective) {
        this->unconnectedDrive = Unknown;
      }
      else if (SVar2 == ResetAllDirective) {
        this->defaultNetType = Unknown;
        this->unconnectedDrive = Unknown;
        this->cellDefine = false;
        (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
      }
      else if (SVar2 == TimeScaleDirective) {
        if ((*(short *)&pSVar8[1].previewNode == 9) && ((short)pSVar8[3].kind == AlwaysCombBlock)) {
          dVar3 = Token::realValue((Token *)&pSVar8[1].previewNode);
          NVar4 = Token::numericFlags((Token *)&pSVar8[1].previewNode);
          oVar6 = TimeScaleValue::fromLiteral(dVar3,NVar4.raw >> 3 & (Picoseconds|Nanoseconds));
          dVar3 = Token::realValue((Token *)(pSVar8 + 3));
          NVar4 = Token::numericFlags((Token *)(pSVar8 + 3));
          oVar7 = TimeScaleValue::fromLiteral(dVar3,NVar4.raw >> 3 & (Picoseconds|Nanoseconds));
          if ((((uint3)oVar6.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::TimeScaleValue> >> 0x10 & 1) != 0) &&
             (((uint3)oVar7.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::TimeScaleValue> & 0x10000) != 0)) {
            if ((this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
              (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
              super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
            }
            (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeScale>._M_payload =
                 (_Storage<slang::TimeScale,_true>)
                 ((uint3)oVar6.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                         super__Optional_payload_base<slang::TimeScaleValue> & 0xffff |
                 (uint)(uint3)oVar7.super__Optional_base<slang::TimeScaleValue,_true,_true>.
                              _M_payload.super__Optional_payload_base<slang::TimeScaleValue> << 0x10
                 );
          }
        }
      }
      else if (SVar2 == DefaultNetTypeDirective) {
        TVar5 = (TokenKind)*(undefined4 *)&pSVar8[1].previewNode;
        if (TVar5 == Identifier) {
          TVar5 = Unknown;
        }
        this->defaultNetType = TVar5;
      }
    }
  }
  return;
}

Assistant:

void visitToken(Token token) {
        // Look through the token's trivia for any preprocessor directives
        // that might need to be captured in the metadata for module decls.
        for (auto t : token.trivia()) {
            if (t.kind == TriviaKind::Directive) {
                auto s = t.syntax();
                switch (s->kind) {
                    case SyntaxKind::DefaultNetTypeDirective:
                        defaultNetType = s->as<DefaultNetTypeDirectiveSyntax>().netType.kind;
                        if (defaultNetType == TokenKind::Identifier)
                            defaultNetType = TokenKind::Unknown;
                        break;
                    case SyntaxKind::UnconnectedDriveDirective:
                        unconnectedDrive = s->as<UnconnectedDriveDirectiveSyntax>().strength.kind;
                        break;
                    case SyntaxKind::NoUnconnectedDriveDirective:
                        unconnectedDrive = TokenKind::Unknown;
                        break;
                    case SyntaxKind::CellDefineDirective:
                        cellDefine = true;
                        break;
                    case SyntaxKind::EndCellDefineDirective:
                        cellDefine = false;
                        break;
                    case SyntaxKind::TimeScaleDirective: {
                        auto& tsd = s->as<TimeScaleDirectiveSyntax>();
                        if (tsd.timeUnit.kind == TokenKind::TimeLiteral &&
                            tsd.timePrecision.kind == TokenKind::TimeLiteral) {
                            auto unit = TimeScaleValue::fromLiteral(
                                tsd.timeUnit.realValue(), tsd.timeUnit.numericFlags().unit());
                            auto prec = TimeScaleValue::fromLiteral(
                                tsd.timePrecision.realValue(),
                                tsd.timePrecision.numericFlags().unit());

                            if (unit && prec)
                                timeScale = {*unit, *prec};
                        }
                        break;
                    }
                    case SyntaxKind::ResetAllDirective:
                        defaultNetType = TokenKind::Unknown;
                        unconnectedDrive = TokenKind::Unknown;
                        cellDefine = false;
                        timeScale = {};
                        break;
                    default:
                        break;
                }
            }
        }
    }